

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddGlobalLinkInformation(cmMakefile *this,cmTarget *target)

{
  bool bVar1;
  char *__s;
  pointer pbVar2;
  cmTargetLinkLibraryType llt;
  allocator<char> local_b1;
  cmMakefile *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string libraryName;
  string local_70;
  string local_50;
  
  if (2 < target->TargetTypeValue - UTILITY) {
    local_b0 = this;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&libraryName,"LINK_LIBRARIES",(allocator<char> *)&local_70);
    __s = GetProperty(local_b0,&libraryName);
    std::__cxx11::string::~string((string *)&libraryName);
    if (__s != (char *)0x0) {
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&libraryName,__s,(allocator<char> *)&local_70);
      cmSystemTools::ExpandListArgument(&libraryName,&linkLibs,false);
      std::__cxx11::string::~string((string *)&libraryName);
      for (pbVar2 = linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 != linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
        std::__cxx11::string::string((string *)&libraryName,(string *)pbVar2);
        bVar1 = std::operator==(&libraryName,"optimized");
        if (bVar1) {
          pbVar2 = pbVar2 + 1;
          std::__cxx11::string::_M_assign((string *)&libraryName);
          llt = OPTIMIZED_LibraryType;
        }
        else {
          bVar1 = std::operator==(&libraryName,"debug");
          llt = GENERAL_LibraryType;
          if (bVar1) {
            pbVar2 = pbVar2 + 1;
            std::__cxx11::string::_M_assign((string *)&libraryName);
            llt = DEBUG_LibraryType;
          }
        }
        cmTarget::AddLinkLibrary(target,local_b0,&libraryName,llt);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"INTERFACE_LINK_LIBRARIES",&local_b1);
        cmTarget::GetDebugGeneratorExpressions(&local_50,target,&libraryName,llt);
        cmTarget::AppendProperty(target,&local_70,local_50._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&libraryName);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&linkLibs);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddGlobalLinkInformation(cmTarget& target)
{
  // for these targets do not add anything
  switch (target.GetType()) {
    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
      return;
    default:;
  }

  if (const char* linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs;
    cmSystemTools::ExpandListArgument(linkLibsProp, linkLibs);

    for (std::vector<std::string>::iterator j = linkLibs.begin();
         j != linkLibs.end(); ++j) {
      std::string libraryName = *j;
      cmTargetLinkLibraryType libType = GENERAL_LibraryType;
      if (libraryName == "optimized") {
        libType = OPTIMIZED_LibraryType;
        ++j;
        libraryName = *j;
      } else if (libraryName == "debug") {
        libType = DEBUG_LibraryType;
        ++j;
        libraryName = *j;
      }
      // This is equivalent to the target_link_libraries plain signature.
      target.AddLinkLibrary(*this, libraryName, libType);
      target.AppendProperty(
        "INTERFACE_LINK_LIBRARIES",
        target.GetDebugGeneratorExpressions(libraryName, libType).c_str());
    }
  }
}